

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestMemCheckHandler::ProcessMemCheckCudaOutput
          (cmCTestMemCheckHandler *this,string *str,string *log,
          vector<int,_std::allocator<int>_> *results)

{
  cmCTest *pcVar1;
  pointer pbVar2;
  int *piVar3;
  iterator __position;
  char *pcVar4;
  size_type sVar5;
  iterator iVar6;
  unsigned_long uVar7;
  string *this_00;
  pointer pRVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  ostream *poVar13;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  _Var15;
  __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
  _Var16;
  long lVar17;
  ulong uVar18;
  unsigned_long *puVar19;
  ulong uVar20;
  initializer_list<cmsys::RegularExpression> __l;
  initializer_list<cmsys::RegularExpression> __l_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonMemcheckOutput;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> matchers;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
  false_positive_matchers;
  ostringstream ostr;
  ostringstream cmCTestLog_msg;
  RegularExpression leakExpr;
  RegularExpression memcheckLine;
  unsigned_long local_db0;
  cmDuration local_da8 [2];
  long local_d98 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d88;
  ulong local_d70;
  unsigned_long *local_d68;
  iterator iStack_d60;
  unsigned_long *local_d58;
  long local_d50;
  string *local_d48;
  vector<int,_std::allocator<int>_> *local_d40;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> local_d38;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> local_d20;
  undefined1 local_d08 [360];
  undefined8 auStack_ba0 [2];
  undefined1 local_b90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b80 [6];
  ios_base local_b20 [64];
  char *local_ae0;
  char *local_ad0;
  int local_ac8;
  RegularExpression local_ac0;
  RegularExpression local_9f0;
  RegularExpression local_920;
  RegularExpression local_850;
  RegularExpression local_780;
  RegularExpression local_6b0;
  RegularExpression local_5e0;
  RegularExpression local_510;
  RegularExpression local_440;
  RegularExpression local_370;
  RegularExpression local_2a0;
  RegularExpression local_1d0;
  RegularExpression local_100;
  size_type sVar14;
  
  local_d88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d40 = results;
  cmsys::SystemTools::Split(str,&local_d88);
  lVar12 = std::__cxx11::string::find((char *)str,0x73bf3b,0);
  iVar11 = (this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d08);
  log->_M_string_length = 0;
  *(log->_M_dataplus)._M_p = '\0';
  local_100.regmust = (char *)0x0;
  local_100.program = (char *)0x0;
  local_100.progsize = 0;
  memset(&local_100,0,0xaa);
  cmsys::RegularExpression::compile(&local_100,"^========");
  local_1d0.regmust = (char *)0x0;
  local_1d0.program = (char *)0x0;
  local_1d0.progsize = 0;
  memset(&local_1d0,0,0xaa);
  cmsys::RegularExpression::compile(&local_1d0,"== Leaked [0-9,]+ bytes at");
  local_ae0 = (char *)0x0;
  local_ad0 = (char *)0x0;
  local_ac8 = 0;
  memset((RegularExpression *)local_b90,0,0xaa);
  cmsys::RegularExpression::compile
            ((RegularExpression *)local_b90,"== Malloc/Free error encountered: (.*)");
  local_ac0.regmust = (char *)0x0;
  local_ac0.program = (char *)0x0;
  local_ac0.progsize = 0;
  memset(&local_ac0,0,0xaa);
  cmsys::RegularExpression::compile(&local_ac0,"== Program hit error ([^ ]*).* on CUDA API call to")
  ;
  local_9f0.regmust = (char *)0x0;
  local_9f0.program = (char *)0x0;
  local_9f0.progsize = 0;
  memset(&local_9f0,0,0xaa);
  cmsys::RegularExpression::compile(&local_9f0,"== Program hit ([^ ]*).* on CUDA API call to");
  local_920.regmust = (char *)0x0;
  local_920.program = (char *)0x0;
  local_920.progsize = 0;
  memset(&local_920,0,0xaa);
  cmsys::RegularExpression::compile(&local_920,"== (Invalid .*) of size [0-9,]+");
  local_850.regmust = (char *)0x0;
  local_850.program = (char *)0x0;
  local_850.progsize = 0;
  memset(&local_850,0,0xaa);
  cmsys::RegularExpression::compile(&local_850,"== (Fatal UVM [CG]PU fault)");
  local_780.regmust = (char *)0x0;
  local_780.program = (char *)0x0;
  local_780.progsize = 0;
  memset(&local_780,0,0xaa);
  cmsys::RegularExpression::compile(&local_780,"== .* (Potential .* hazard detected)");
  local_6b0.regmust = (char *)0x0;
  local_6b0.program = (char *)0x0;
  local_6b0.progsize = 0;
  memset(&local_6b0,0,0xaa);
  cmsys::RegularExpression::compile(&local_6b0,"== .* (Race reported)");
  local_5e0.regmust = (char *)0x0;
  local_5e0.program = (char *)0x0;
  local_5e0.progsize = 0;
  memset(&local_5e0,0,0xaa);
  cmsys::RegularExpression::compile(&local_5e0,"== (Barrier error)");
  local_510.regmust = (char *)0x0;
  local_510.program = (char *)0x0;
  local_510.progsize = 0;
  memset(&local_510,0,0xaa);
  cmsys::RegularExpression::compile(&local_510,"== (Uninitialized .* memory read)");
  local_440.regmust = (char *)0x0;
  local_440.program = (char *)0x0;
  local_440.progsize = 0;
  memset(&local_440,0,0xaa);
  cmsys::RegularExpression::compile(&local_440,"== (Unused memory)");
  local_370.regmust = (char *)0x0;
  local_370.program = (char *)0x0;
  local_370.progsize = 0;
  memset(&local_370,0,0xaa);
  cmsys::RegularExpression::compile(&local_370,"== (Host API memory access error)");
  local_2a0.regmust = (char *)0x0;
  local_2a0.program = (char *)0x0;
  local_2a0.progsize = 0;
  memset(&local_2a0,0,0xaa);
  cmsys::RegularExpression::compile(&local_2a0,"== ([A-Z][a-z].*)");
  __l._M_len = 0xc;
  __l._M_array = (iterator)local_b90;
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&local_d38,__l,(allocator_type *)local_da8);
  lVar17 = 0x9c0;
  do {
    if (*(void **)((long)auStack_ba0 + lVar17) != (void *)0x0) {
      operator_delete__(*(void **)((long)auStack_ba0 + lVar17));
    }
    lVar17 = lVar17 + -0xd0;
  } while (lVar17 != 0);
  local_ae0 = (char *)0x0;
  local_ad0 = (char *)0x0;
  local_ac8 = 0;
  memset((RegularExpression *)local_b90,0,0xaa);
  cmsys::RegularExpression::compile
            ((RegularExpression *)local_b90,"== Error: No attachable process found.*timed-out");
  local_ac0.regmust = (char *)0x0;
  local_ac0.program = (char *)0x0;
  local_ac0.progsize = 0;
  memset(&local_ac0,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_ac0,"== Default timeout can be adjusted with --launch-timeout");
  local_9f0.regmust = (char *)0x0;
  local_9f0.program = (char *)0x0;
  local_9f0.progsize = 0;
  memset(&local_9f0,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_9f0,"== Error: Target application terminated before first instrumented API");
  local_920.regmust = (char *)0x0;
  local_920.program = (char *)0x0;
  local_920.progsize = 0;
  memset(&local_920,0,0xaa);
  cmsys::RegularExpression::compile
            (&local_920,"== Tracking kernels launched by child processes requires");
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)local_b90;
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&local_d20,__l_00,(allocator_type *)local_da8);
  lVar17 = 0x340;
  do {
    if (*(void **)((long)auStack_ba0 + lVar17) != (void *)0x0) {
      operator_delete__(*(void **)((long)auStack_ba0 + lVar17));
    }
    lVar17 = lVar17 + -0xd0;
  } while (lVar17 != 0);
  local_d68 = (unsigned_long *)0x0;
  iStack_d60._M_current = (unsigned_long *)0x0;
  local_d58 = (unsigned_long *)0x0;
  lVar17 = std::chrono::_V2::steady_clock::now();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b90);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b90,"Start test: ",0xc);
  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_b90);
  std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x4a7,(char *)local_da8[0].__r,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if ((long *)local_da8[0].__r != local_d98) {
    operator_delete((void *)local_da8[0].__r,local_d98[0] + 1);
  }
  local_d50 = lVar17;
  local_d48 = log;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b90);
  std::ios_base::~ios_base(local_b20);
  local_db0 = 0;
  if (local_d88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_d88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar18 = 0;
    local_d70 = 0;
    puVar19 = local_d68;
    iVar6._M_current = iStack_d60._M_current;
  }
  else {
    local_d70 = 0;
    uVar18 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b90);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b90,"test line ",10);
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_b90,
                           local_d88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_db0]._M_dataplus._M_p,
                           local_d88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_db0]._M_string_length);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x4ab,(char *)local_da8[0].__r,
                   (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
      if ((long *)local_da8[0].__r != local_d98) {
        operator_delete((void *)local_da8[0].__r,local_d98[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b90);
      std::ios_base::~ios_base(local_b20);
      bVar9 = cmsys::RegularExpression::find
                        (&local_100,
                         local_d88.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_db0]._M_dataplus._M_p,
                         &local_100.regmatch);
      if (bVar9) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b90);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_b90,"cuda sanitizer line ",0x14);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_b90,
                             local_d88.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_db0]._M_dataplus._M_p,
                             local_d88.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_db0]._M_string_length);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                     ,0x4b0,(char *)local_da8[0].__r,
                     (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
        if ((long *)local_da8[0].__r != local_d98) {
          operator_delete((void *)local_da8[0].__r,local_d98[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b90);
        std::ios_base::~ios_base(local_b20);
        pbVar2 = local_d88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = local_db0;
        bVar9 = cmsys::RegularExpression::find
                          (&local_1d0,
                           local_d88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_db0]._M_dataplus._M_p,
                           &local_1d0.regmatch);
        if (bVar9) {
          local_b90._0_8_ = local_b80;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b90,"Memory leak","");
          sVar14 = FindOrAddWarning(this,(string *)local_b90);
          uVar10 = (uint)sVar14;
LAB_001ccc9d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b90._0_8_ != local_b80) {
            operator_delete((void *)local_b90._0_8_,
                            CONCAT71(local_b80[0]._M_allocated_capacity._1_7_,
                                     local_b80[0]._M_local_buf[0]) + 1);
          }
          if (-1 < (int)uVar10) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d08,"<b>",3);
            uVar20 = (ulong)(uVar10 & 0x7fffffff);
            pbVar2 = (this->ResultStrings).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_d08,pbVar2[uVar20]._M_dataplus._M_p,
                                 pbVar2[uVar20]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar13,"</b> ",5);
            piVar3 = (local_d40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            __position._M_current =
                 (local_d40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if ((piVar3 == __position._M_current) ||
               (((long)__position._M_current - (long)piVar3 >> 2) - 1U < uVar20)) {
              local_b90._0_4_ = 1;
              if (__position._M_current ==
                  (local_d40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (local_d40,__position,(int *)local_b90);
              }
              else {
                *__position._M_current = 1;
                (local_d40->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
            }
            else {
              piVar3[uVar20] = piVar3[uVar20] + 1;
            }
            local_d70 = (ulong)((int)local_d70 + 1);
          }
        }
        else {
          _Var15 = std::
                   find_if<__gnu_cxx::__normal_iterator<cmsys::RegularExpression*,std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>>,cmCTestMemCheckHandler::ProcessMemCheckCudaOutput(std::__cxx11::string_const&,std::__cxx11::string&,std::vector<int,std::allocator<int>>&)::__0>
                             ((__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                               )local_d38.
                                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                              (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                               )local_d38.
                                super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                                ._M_impl.super__Vector_impl_data._M_finish,pbVar2 + uVar7);
          pRVar8 = local_d20.
                   super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((_Var15._M_current !=
               local_d38.
               super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             (_Var16 = std::
                       find_if<__gnu_cxx::__normal_iterator<cmsys::RegularExpression*,std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>>,cmCTestMemCheckHandler::ProcessMemCheckCudaOutput(std::__cxx11::string_const&,std::__cxx11::string&,std::vector<int,std::allocator<int>>&)::__0>
                                 ((__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                   )local_d20.
                                    super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                  (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                   )local_d20.
                                    super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,pbVar2 + uVar7),
             _Var16._M_current == pRVar8)) {
            pcVar4 = ((_Var15._M_current)->regmatch).startp[1];
            if (pcVar4 == (char *)0x0) {
              local_b90._0_8_ = local_b80;
              local_b90._8_8_ = (char *)0x0;
              local_b80[0]._M_local_buf[0] = '\0';
            }
            else {
              local_b90._0_8_ = local_b80;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_b90,pcVar4,((_Var15._M_current)->regmatch).endp[1]);
            }
            sVar14 = FindOrAddWarning(this,(string *)local_b90);
            uVar10 = (uint)sVar14;
            goto LAB_001ccc9d;
          }
        }
        sVar5 = local_d88.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_db0]._M_string_length;
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_d08,
                             local_d88.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_db0]._M_dataplus._M_p,
                             sVar5);
        std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        uVar18 = uVar18 + sVar5;
      }
      else if (iStack_d60._M_current == local_d58) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_d68,iStack_d60,
                   &local_db0);
      }
      else {
        *iStack_d60._M_current = local_db0;
        iStack_d60._M_current = iStack_d60._M_current + 1;
      }
      local_db0 = local_db0 + 1;
      puVar19 = local_d68;
      iVar6._M_current = iStack_d60._M_current;
    } while (local_db0 <
             (ulong)((long)local_d88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_d88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  do {
    if (puVar19 == iVar6._M_current) {
LAB_001ccfc1:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b90);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_b90,"End test (elapsed: ",0x13);
      this_00 = local_d48;
      lVar12 = std::chrono::_V2::steady_clock::now();
      local_da8[0].__r = (double)(lVar12 - local_d50) / 1000000000.0;
      cmDurationTo<unsigned_int>(local_da8);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)local_b90);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"s)",2);
      std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x4eb,(char *)local_da8[0].__r,
                   (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
      if ((long *)local_da8[0].__r != local_d98) {
        operator_delete((void *)local_da8[0].__r,local_d98[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b90);
      std::ios_base::~ios_base(local_b20);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)this_00,(string *)local_b90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b90._0_8_ != local_b80) {
        operator_delete((void *)local_b90._0_8_,
                        CONCAT71(local_b80[0]._M_allocated_capacity._1_7_,
                                 local_b80[0]._M_local_buf[0]) + 1);
      }
      iVar11 = (int)local_d70;
      this->DefectCount = this->DefectCount + iVar11;
      if (local_d68 != (unsigned_long *)0x0) {
        operator_delete(local_d68,(long)local_d58 - (long)local_d68);
      }
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
                (&local_d20);
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::~vector
                (&local_d38);
      if (local_1d0.program != (char *)0x0) {
        operator_delete__(local_1d0.program);
      }
      if (local_100.program != (char *)0x0) {
        operator_delete__(local_100.program);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d08);
      std::ios_base::~ios_base((ios_base *)(local_d08 + 0x70));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d88);
      return iVar11 == 0;
    }
    sVar5 = local_d88.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[*puVar19]._M_string_length;
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_d08,
                         local_d88.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[*puVar19]._M_dataplus._M_p,sVar5)
    ;
    std::ios::widen((char)poVar13->_vptr_basic_ostream[-3] + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    uVar18 = uVar18 + sVar5;
    if ((ulong)(long)(this->super_cmCTestTestHandler).CustomMaximumFailedTestOutputSize < uVar18 &&
        (lVar12 == -1 && iVar11 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d08,"....\n",5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_d08,
                 "Test Output for this test has been truncated see testing machine logs for full output,\n"
                 ,0x57);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_d08,
                 "or put CTEST_FULL_OUTPUT in the output of this test program.\n",0x3d);
      goto LAB_001ccfc1;
    }
    puVar19 = puVar19 + 1;
  } while( true );
}

Assistant:

bool cmCTestMemCheckHandler::ProcessMemCheckCudaOutput(
  const std::string& str, std::string& log, std::vector<int>& results)
{
  std::vector<std::string> lines;
  cmsys::SystemTools::Split(str, lines);
  bool unlimitedOutput = false;
  if (str.find("CTEST_FULL_OUTPUT") != std::string::npos ||
      this->CustomMaximumFailedTestOutputSize == 0) {
    unlimitedOutput = true;
  }

  std::string::size_type cc;

  std::ostringstream ostr;
  log.clear();

  int defects = 0;

  cmsys::RegularExpression memcheckLine("^========");

  cmsys::RegularExpression leakExpr("== Leaked [0-9,]+ bytes at");

  // list of matchers for output messages that contain variable content
  // (addresses, sizes, ...) or can be shortened in general. the first match is
  // used as a error name.
  std::vector<cmsys::RegularExpression> matchers{
    // API errors
    "== Malloc/Free error encountered: (.*)",
    "== Program hit error ([^ ]*).* on CUDA API call to",
    "== Program hit ([^ ]*).* on CUDA API call to",
    // memcheck
    "== (Invalid .*) of size [0-9,]+", "== (Fatal UVM [CG]PU fault)",
    // racecheck
    "== .* (Potential .* hazard detected)", "== .* (Race reported)",
    // synccheck
    "== (Barrier error)",
    // initcheck
    "== (Uninitialized .* memory read)", "== (Unused memory)",
    "== (Host API memory access error)",
    // generic error: ignore ERROR SUMMARY, CUDA-MEMCHECK and others
    "== ([A-Z][a-z].*)"
  };
  // matchers for messages that aren't defects, but caught by above matchers
  std::vector<cmsys::RegularExpression> false_positive_matchers{
    "== Error: No attachable process found.*timed-out",
    "== Default timeout can be adjusted with --launch-timeout",
    "== Error: Target application terminated before first instrumented API",
    "== Tracking kernels launched by child processes requires"
  };

  std::vector<std::string::size_type> nonMemcheckOutput;
  auto sttime = std::chrono::steady_clock::now();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Start test: " << lines.size() << std::endl, this->Quiet);
  std::string::size_type totalOutputSize = 0;
  for (cc = 0; cc < lines.size(); cc++) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "test line " << lines[cc] << std::endl, this->Quiet);

    if (memcheckLine.find(lines[cc])) {
      cmCTestOptionalLog(this->CTest, DEBUG,
                         "cuda sanitizer line " << lines[cc] << std::endl,
                         this->Quiet);
      int failure = -1;
      auto& line = lines[cc];
      if (leakExpr.find(line)) {
        failure = static_cast<int>(this->FindOrAddWarning("Memory leak"));
      } else {
        auto match_predicate =
          [&line](cmsys::RegularExpression& matcher) -> bool {
          return matcher.find(line);
        };
        auto const pos_matcher =
          std::find_if(matchers.begin(), matchers.end(), match_predicate);
        if (pos_matcher != matchers.end()) {
          if (!std::any_of(false_positive_matchers.begin(),
                           false_positive_matchers.end(), match_predicate)) {
            failure =
              static_cast<int>(this->FindOrAddWarning(pos_matcher->match(1)));
          }
        }
      }

      if (failure >= 0) {
        ostr << "<b>" << this->ResultStrings[failure] << "</b> ";
        if (results.empty() ||
            static_cast<unsigned>(failure) > results.size() - 1) {
          results.push_back(1);
        } else {
          results[failure]++;
        }
        defects++;
      }
      totalOutputSize += lines[cc].size();
      ostr << lines[cc] << std::endl;
    } else {
      nonMemcheckOutput.push_back(cc);
    }
  }
  // Now put all all the non cuda sanitizer output into the test output
  // This should be last in case it gets truncated by the output
  // limiting code
  for (std::string::size_type i : nonMemcheckOutput) {
    totalOutputSize += lines[i].size();
    ostr << lines[i] << std::endl;
    if (!unlimitedOutput &&
        totalOutputSize >
          static_cast<size_t>(this->CustomMaximumFailedTestOutputSize)) {
      ostr << "....\n";
      ostr << "Test Output for this test has been truncated see testing"
              " machine logs for full output,\n";
      ostr << "or put CTEST_FULL_OUTPUT in the output of "
              "this test program.\n";
      break; // stop the copy of output if we are full
    }
  }
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "End test (elapsed: "
                       << cmDurationTo<unsigned int>(
                            std::chrono::steady_clock::now() - sttime)
                       << "s)" << std::endl,
                     this->Quiet);
  log = ostr.str();
  this->DefectCount += defects;
  return defects == 0;
}